

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileWatcher.cpp
# Opt level: O1

void __thiscall wmj::fileWatcher::fileWatcher::run(fileWatcher *this)

{
  code *pcVar1;
  size_type sVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  undefined4 uVar6;
  bool bVar7;
  function<void_()> *in_RSI;
  fileWatcher *pfVar8;
  _Any_data _Stack_60;
  code *pcStack_50;
  size_type sStack_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  int iStack_38;
  undefined4 uStack_34;
  fileWatcher *pfStack_28;
  function<void_()> *pfStack_20;
  
  if (this->need_watching == true) {
    do {
      pfStack_20 = (function<void_()> *)0x102a8d;
      pfVar8 = this;
      bVar7 = watchOnce(this);
      if (bVar7) {
        if ((this->call_back_func).super__Function_base._M_manager == (_Manager_type)0x0) {
          pfStack_20 = (function<void_()> *)0x102ab1;
          std::__throw_bad_function_call();
          pfStack_28 = this;
          pfStack_20 = &this->call_back_func;
          std::function<void_()>::function((function<void_()> *)&_Stack_60,in_RSI);
          uStack_40 = _Stack_60._0_4_;
          uStack_3c = _Stack_60._4_4_;
          iStack_38 = _Stack_60._8_4_;
          uStack_34 = _Stack_60._12_4_;
          uVar3 = *(undefined4 *)&pfVar8->_vptr_fileWatcher;
          uVar4 = *(undefined4 *)((long)&pfVar8->_vptr_fileWatcher + 4);
          iVar5 = pfVar8->inotify_fd;
          uVar6 = *(undefined4 *)&pfVar8->field_0xc;
          *(undefined4 *)&pfVar8->_vptr_fileWatcher = _Stack_60._0_4_;
          *(undefined4 *)((long)&pfVar8->_vptr_fileWatcher + 4) = _Stack_60._4_4_;
          pfVar8->inotify_fd = _Stack_60._8_4_;
          *(undefined4 *)&pfVar8->field_0xc = _Stack_60._12_4_;
          pcVar1 = (code *)(pfVar8->file_name)._M_dataplus._M_p;
          (pfVar8->file_name)._M_dataplus._M_p = (pointer)pcStack_50;
          sVar2 = (pfVar8->file_name)._M_string_length;
          (pfVar8->file_name)._M_string_length = sStack_48;
          if (pcVar1 != (code *)0x0) {
            _Stack_60._0_4_ = uVar3;
            _Stack_60._4_4_ = uVar4;
            _Stack_60._8_4_ = iVar5;
            _Stack_60._12_4_ = uVar6;
            pcStack_50 = pcVar1;
            sStack_48 = sVar2;
            (*pcVar1)(&_Stack_60,&_Stack_60,__destroy_functor);
          }
          return;
        }
        pfStack_20 = (function<void_()> *)0x102a9e;
        (*(this->call_back_func)._M_invoker)((_Any_data *)&this->call_back_func);
      }
    } while (this->need_watching != false);
  }
  return;
}

Assistant:

void fileWatcher::run() {
    while(need_watching) {
        if(watchOnce()) {
            this->call_back_func();
        }
    }
}